

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

String __thiscall testing::internal::StreamableToString<char*>(internal *this,char **streamable)

{
  size_t extraout_RDX;
  String SVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  Message::Message((Message *)&local_20);
  Message::operator<<((Message *)&local_20,streamable);
  Message::GetString((Message *)this);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_20);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)this;
  return SVar1;
}

Assistant:

String StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}